

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void add_intrinsic_4f_s1_f_f_f(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *dt2;
  MOJOSHADER_astDataType *ret;
  
  ret = get_usertype(ctx,"float4");
  dt2 = &ctx->dt_float;
  add_intrinsic4(ctx,fn,ret,&ctx->dt_sampler1d,dt2,dt2,dt2);
  return;
}

Assistant:

static void add_intrinsic_4f_s1_f_f_f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *dt = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *f = &ctx->dt_float;
    add_intrinsic4(ctx, fn, dt, &ctx->dt_sampler1d, f, f, f);
}